

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O0

int16_t __thiscall BoxNesting::HopcroftKarpAlgorithm::runAlgorithm(HopcroftKarpAlgorithm *this)

{
  bool bVar1;
  HopcroftKarpAlgorithm *this_00;
  vector<short,_std::allocator<short>_> *this_01;
  allocator_type *__a;
  reference pvVar2;
  long in_RDI;
  HopcroftKarpAlgorithm *unaff_retaddr;
  int16_t i;
  int16_t visibleBoxes;
  allocator_type *in_stack_ffffffffffffff48;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffff50;
  vector<short,_std::allocator<short>_> *this_02;
  size_type in_stack_ffffffffffffff58;
  undefined1 *__n;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffff60;
  short local_78;
  int16_t local_76;
  vector<short,_std::allocator<short>_> local_73 [3];
  undefined1 local_20 [32];
  
  this_00 = (HopcroftKarpAlgorithm *)(long)(*(short *)(in_RDI + 0x18) + 1);
  std::allocator<short>::allocator((allocator<short> *)0x1371bb);
  std::vector<short,_std::allocator<short>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (value_type_conflict4 *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __n = local_20;
  std::vector<short,_std::allocator<short>_>::operator=
            (in_stack_ffffffffffffff50,
             (vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffff48);
  std::vector<short,_std::allocator<short>_>::~vector(in_stack_ffffffffffffff50);
  std::allocator<short>::~allocator((allocator<short> *)0x13720d);
  this_01 = (vector<short,_std::allocator<short>_> *)(long)(*(short *)(in_RDI + 0x1a) + 1);
  std::allocator<short>::allocator((allocator<short> *)0x13722e);
  std::vector<short,_std::allocator<short>_>::vector
            (this_01,(size_type)__n,(value_type_conflict4 *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::vector<short,_std::allocator<short>_>::operator=
            (in_stack_ffffffffffffff50,
             (vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffff48);
  std::vector<short,_std::allocator<short>_>::~vector(in_stack_ffffffffffffff50);
  std::allocator<short>::~allocator((allocator<short> *)0x137277);
  __a = (allocator_type *)(long)(*(short *)(in_RDI + 0x18) + 1);
  local_73[0].super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start._1_2_ = 0;
  this_02 = local_73;
  std::allocator<short>::allocator((allocator<short> *)0x13729f);
  std::vector<short,_std::allocator<short>_>::vector
            (this_01,(size_type)__n,(value_type_conflict4 *)this_02,__a);
  std::vector<short,_std::allocator<short>_>::operator=
            (this_02,(vector<short,_std::allocator<short>_> *)__a);
  std::vector<short,_std::allocator<short>_>::~vector(this_02);
  std::allocator<short>::~allocator((allocator<short> *)0x1372e1);
  local_76 = *(int16_t *)(in_RDI + 0x18);
  while (bVar1 = bfs(unaff_retaddr), bVar1) {
    for (local_78 = 1; local_78 <= *(short *)(in_RDI + 0x18); local_78 = local_78 + 1) {
      pvVar2 = std::vector<short,_std::allocator<short>_>::operator[]
                         ((vector<short,_std::allocator<short>_> *)(in_RDI + 0x20),(long)local_78);
      if ((*pvVar2 == 0) && (bVar1 = dfs(this_00,(int16_t)((ulong)in_RDI >> 0x30)), bVar1)) {
        local_76 = local_76 + -1;
      }
    }
  }
  return local_76;
}

Assistant:

int16_t HopcroftKarpAlgorithm::runAlgorithm() const
{
	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount + 1, NILL);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount + 1, NILL);
	this->distances = std::vector<int16_t>(this->leftVerticesCount + 1, 0);

	// We have the same amount of visible boxes as there
	// are vertices in the left partition
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;

	while (bfs()) 
	{ 
		// Find a free vertex 
		for (int16_t i = 1; i <= leftVerticesCount; ++i)
		{
			if (pairsLeft[i] == NILL && this->dfs(i))
			{
				--visibleBoxes;
			}
		}
	}

	return visibleBoxes;
}